

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

void CVmPack::unpack_group
               (CVmPackPos *p,CVmObjList *retlst_par,int *retcnt_par,CVmPackGroup *group,
               int list_per_iter)

{
  char *buf;
  vm_obj_id_t vVar1;
  CVmDataSource *pCVar2;
  uint16_t tmp;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CVmObjList *retlst;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  vm_obj_id_t *prefix_count;
  vm_obj_id_t *retcnt;
  int cnt;
  int grpcnt;
  vm_val_t cntval;
  vm_obj_id_t local_60 [2];
  CVmDataSource *local_58;
  CVmObjList *local_50;
  int *local_48;
  vm_val_t local_40;
  
  pCVar2 = group->ds;
  local_58 = pCVar2;
  if ((group->num_iters == -2) || (group->up_to_iters != 0)) {
    iVar3 = (*pCVar2->_vptr_CVmDataSource[7])(pCVar2);
    iVar4 = (*pCVar2->_vptr_CVmDataSource[6])(pCVar2);
    if (CONCAT44(extraout_var_00,iVar4) <= CONCAT44(extraout_var,iVar3)) {
      (p->p).p_ = (group->start).p.p_;
      p->len = (group->start).len;
      p->idx = (group->start).idx;
      skip_group(p,group->close_paren);
      return;
    }
  }
  local_60[1] = 0;
  retlst = retlst_par;
  local_50 = retlst_par;
  local_48 = retcnt_par;
  retcnt = (vm_obj_id_t *)retcnt_par;
  if (list_per_iter != 0) {
    retlst = create_group_sublist(retlst_par,retcnt_par);
    retcnt = local_60 + 1;
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          CVmPackPos::getch(p);
          if (p->len == 0) {
            return;
          }
          wVar5 = CVmPackPos::getch(p);
          pCVar2 = local_58;
          if ((wVar5 != L'[') && (wVar5 != L'(')) break;
          unpack_subgroup(p,retlst,(int *)retcnt,group,(int *)0x0);
        }
        if (wVar5 != group->close_paren) break;
        group->cur_iter = group->cur_iter + 1;
        if (list_per_iter != 0) {
          *(short *)(retlst->super_CVmObjCollection).super_CVmObject.ext_ = (short)*retcnt;
        }
        if (group->num_iters == -2) {
          iVar3 = (*local_58->_vptr_CVmDataSource[7])(local_58);
          iVar4 = (*pCVar2->_vptr_CVmDataSource[6])(pCVar2);
          if (CONCAT44(extraout_var_02,iVar4) <= CONCAT44(extraout_var_01,iVar3)) {
            return;
          }
        }
        else if (group->num_iters < group->cur_iter) {
          return;
        }
        pCVar2 = local_58;
        if (group->up_to_iters != 0) {
          iVar3 = (*local_58->_vptr_CVmDataSource[7])(local_58);
          iVar4 = (*pCVar2->_vptr_CVmDataSource[6])(pCVar2);
          if (CONCAT44(extraout_var_04,iVar4) <= CONCAT44(extraout_var_03,iVar3)) {
            return;
          }
        }
        (p->p).p_ = (group->start).p.p_;
        p->len = (group->start).len;
        p->idx = (group->start).idx;
        iVar3 = (*group->ds->_vptr_CVmDataSource[7])();
        group->stream_ofs = CONCAT44(extraout_var_05,iVar3);
        if (list_per_iter != 0) {
          retlst = create_group_sublist(local_50,local_48);
          local_60[1] = 0;
        }
      }
      if (wVar5 == L'/') break;
      prefix_count = (vm_obj_id_t *)0x0;
LAB_002aa258:
      unpack_iter_item(p,retlst,(int *)retcnt,group,(int *)prefix_count);
    }
    if (retcnt == (vm_obj_id_t *)0x0) {
      err_throw_a(0x6b,1,0,(ulong)(uint)p->idx);
    }
    vVar1 = *retcnt;
    *retcnt = vVar1 - 1;
    buf = (retlst->super_CVmObjCollection).super_CVmObject.ext_ + (long)(int)vVar1 * 5 + -3;
    local_40.typ = (vm_datatype_t)*buf;
    vmb_get_dh_val(buf,&local_40);
    uVar6 = local_40.val.obj;
    if (local_40.typ != VM_INT) {
      uVar6 = vm_val_t::nonint_cast_to_int(&local_40);
    }
    local_60[0] = uVar6;
    CVmPackPos::inc(p);
    wVar5 = CVmPackPos::getch(p);
    if ((wVar5 != L'[') && (wVar5 != L'(')) {
      prefix_count = local_60;
      goto LAB_002aa258;
    }
    unpack_subgroup(p,retlst,(int *)retcnt,group,(int *)local_60);
  } while( true );
}

Assistant:

void CVmPack::unpack_group(VMG_ CVmPackPos *p,
                           CVmObjList *retlst_par, int *retcnt_par,
                           CVmPackGroup *group, int list_per_iter)
{
    /* get the data source */
    CVmDataSource *src = group->ds;

    /* 
     *   If the group has an "up to" count (e.g., "30*"), check to see if
     *   we're already at EOF, and if so don't unpack anything - an iteration
     *   count of zero is valid for an up-to count. 
     */
    if ((group->num_iters == ITER_STAR || group->up_to_iters)
        && src->get_pos() >= src->get_size())
    {
        /* skip the group in the source */
        p->set(&group->start);
        skip_group(p, group->close_paren);

        /* we're done */
        return;
    }

    /* assume we'll unpack directly into the parent list */
    CVmObjList *retlst = retlst_par;
    int *retcnt = retcnt_par;

    /* 
     *   if we're unpacking into a per-instance sublist, create the sublist
     *   for the first iteration, and set this as the output list instead of
     *   unpacking directly into the parent list
     */
    int grpcnt = 0;
    if (list_per_iter)
    {
        retlst = create_group_sublist(vmg_ retlst_par, retcnt_par);
        retcnt = &grpcnt;
    }

    /* run through the format list */
    while (p->more())
    {
        /* check for group entry/exit and repeat counts */
        wchar_t c = p->getch();
        if (c == '(' || c == '[')
        {
            /* start of a group - unpack the sub-group */
            unpack_subgroup(vmg_ p, retlst, *retcnt, group, 0);
        }
        else if (c == group->close_paren)
        {
            /* end of group - count the completed iteration */
            group->cur_iter++;

            /* 
             *   if we're unpacking into a per-iteration sublist, note the
             *   final group count in the sublist 
             */
            if (list_per_iter)
                retlst->cons_set_len(*retcnt);

            /* 
             *   We're done with the group if (a) we have a '*' iteration
             *   count, and we're at end of file, or (b) we've reached the
             *   desired iteration count.  If done, simply return to the
             *   enclosing group. 
             */
            if (group->num_iters == ITER_STAR
                ? src->get_pos() >= src->get_size()
                : group->cur_iter > group->num_iters)
                return;

            /* 
             *   if we have an 'up to' iteration count, stop if we're at EOF
             *   even if we haven't exhausted the numeric iteration count 
             */
            if (group->up_to_iters && src->get_pos() >= src->get_size())
                return;

            /* return to the start of the group template for the next round */
            p->set(&group->start);
            group->stream_ofs = group->ds->get_pos();

            /* 
             *   If we're unpacking into a sublist per iteration, create the
             *   new sublist for the new iteration. 
             */
            if (list_per_iter)
            {
                retlst = create_group_sublist(vmg_ retlst_par, retcnt_par);
                grpcnt = 0;
            }
        }
        else if (c == '/')
        {
            /*
             *   Repeat count prefix.  Remove the preceding return list
             *   element and interpret it as an integer.  Make sure there
             *   actually is an item in the list - it's an error if not.  
             */
            if (retcnt == 0)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());
            
            /* remove the item and cast it to integer */
            vm_val_t cntval;
            retlst->get_element(--(*retcnt), &cntval);
            int cnt = (int)cntval.cast_to_int(vmg0_);

            /* skip the '/' and check what follows */
            p->inc();
            if ((c = p->getch()) == '(' || c == '[')
            {
                /* it's a group - unpack the group with the count */
                unpack_subgroup(vmg_ p, retlst, *retcnt, group, &cnt);
            }
            else
            {
                /* it's a single item - unpack the repeated items */
                unpack_iter_item(vmg_ p, retlst, *retcnt, group, &cnt);
            }
        }
        else
        {
            /* it's a regular item, possibly iterated - unpack it */
            unpack_iter_item(vmg_ p, retlst, *retcnt, group, 0);
        }
    }
}